

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImportBaseDirWrapper.cpp
# Opt level: O3

bool imports_util::isNameValid(Executable *pe,char *myName)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  bufsize_t maxInp;
  size_t sVar3;
  size_t sVar4;
  string local_38;
  
  if (myName != (char *)0x0) {
    iVar2 = (*(pe->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[6])(pe,myName,0);
    maxInp = AbstractByteBuffer::getMaxSizeFromOffset
                       (&pe->super_AbstractByteBuffer,CONCAT44(extraout_var,iVar2));
    if (maxInp == 0) {
      return false;
    }
    bVar1 = pe_util::hasNonPrintable(myName,maxInp);
    if (!bVar1) {
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      sVar3 = strlen(myName);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,myName,myName + sVar3);
      sVar4 = pe_util::noWhiteCount(&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p == &local_38.field_2) {
        return sVar4 != 0;
      }
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      return sVar4 != 0;
    }
  }
  return false;
}

Assistant:

bool imports_util::isNameValid(Executable *pe, char* myName)
{
    if (!myName) return false; // do not parse, invalid entry
    bufsize_t upperLimit = pe->getMaxSizeFromPtr((BYTE*) myName);
    if (upperLimit == 0) return false;

    bool isInvalid = pe_util::hasNonPrintable(myName, upperLimit);
    if (isInvalid) return false;
    if (pe_util::noWhiteCount(myName) == 0) return false;

    return true;
}